

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  string local_70 [8];
  string c;
  allocator<char> local_39;
  string local_38 [8];
  string p;
  char **argv_local;
  int argc_local;
  
  p.field_2._8_8_ = argv;
  if (argc == 2) {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    R5R::Decrypt(local_70);
    poVar1 = std::operator<<((ostream *)&std::cout,local_70);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage: r5r-dec <ciphertext>");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc == 2)
    {
        string p = argv[1];
        string c = R5R::Decrypt(p);
        cout << c << endl;
    }
    else
    {
        cout << "Usage: r5r-dec <ciphertext>" << endl;
    }
    return 0;
}